

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

void __thiscall QWizardPrivate::updatePalette(QWizardPrivate *this)

{
  QBrush *pQVar1;
  long in_FS_OFFSET;
  QBrush local_70 [8];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->wizStyle == MacStyle) {
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QApplication::palette((QApplication *)local_48,&this->pageFrame->super_QWidget);
    pQVar1 = QPalette::brush((QPalette *)local_48,Window);
    local_58 = *(undefined8 *)(*(long *)pQVar1 + 8);
    uStack_50 = *(undefined8 *)(*(long *)pQVar1 + 0x10);
    QColor::setAlpha((int)&local_58);
    QBrush::QBrush((QBrush *)&local_68,(QColor *)&local_58,SolidPattern);
    QPalette::setBrush((QPalette *)local_48,Window,(QBrush *)&local_68);
    QBrush::~QBrush((QBrush *)&local_68);
    pQVar1 = QPalette::brush((QPalette *)local_48,Base);
    local_68 = *(undefined8 *)(*(long *)pQVar1 + 8);
    uStack_60 = *(undefined8 *)(*(long *)pQVar1 + 0x10);
    QColor::setAlpha((int)&local_68);
    QBrush::QBrush(local_70,(QColor *)&local_68,SolidPattern);
    QPalette::setBrush((QPalette *)local_48,Base,local_70);
    QBrush::~QBrush(local_70);
    QWidget::setPalette(&this->pageFrame->super_QWidget,(QPalette *)local_48);
    QPalette::~QPalette((QPalette *)local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizardPrivate::updatePalette() {
    if (wizStyle == QWizard::MacStyle) {
        // This is required to ensure visual semitransparency when
        // switching from ModernStyle to MacStyle.
        // See TAG1 in recreateLayout
        // This additionally ensures that the colors are correct
        // when the theme is changed.

        // we should base the new palette on the default one
        // so theme colors will be correct
        QPalette newPalette = QApplication::palette(pageFrame);

        QColor windowColor = newPalette.brush(QPalette::Window).color();
        windowColor.setAlpha(153);
        newPalette.setBrush(QPalette::Window, windowColor);

        QColor baseColor = newPalette.brush(QPalette::Base).color();
        baseColor.setAlpha(153);
        newPalette.setBrush(QPalette::Base, baseColor);

        pageFrame->setPalette(newPalette);
    }
}